

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O3

Scope * slang::analysis::getAsScope(Symbol *symbol)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  
  if (symbol->kind != CheckerInstance) {
    if (symbol->kind != Instance) {
      pSVar1 = (Scope *)(*(code *)(&DAT_0047ffbc + *(int *)(&DAT_0047ffbc + (ulong)symbol->kind * 4)
                                  ))();
      return pSVar1;
    }
    pSVar2 = symbol[1].originatingSyntax;
    if (pSVar2 != (SyntaxNode *)0x0) goto LAB_00369001;
  }
  pSVar2 = (SyntaxNode *)symbol[1].name._M_str;
LAB_00369001:
  return (Scope *)&pSVar2[2].previewNode;
}

Assistant:

static const Scope& getAsScope(const Symbol& symbol) {
    switch (symbol.kind) {
        case SymbolKind::Instance: {
            auto& inst = symbol.as<InstanceSymbol>();
            if (auto body = inst.getCanonicalBody())
                return *body;
            return inst.body;
        }
        case SymbolKind::CheckerInstance:
            return symbol.as<CheckerInstanceSymbol>().body;
        default:
            return symbol.as<Scope>();
    }
}